

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
Graph<std::pair<double,_double>_>::twoOptSwap
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          Graph<std::pair<double,_double>_> *this,vector<int,_std::allocator<int>_> *ord,int *i,
          int *k)

{
  iterator iVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  pointer piVar5;
  pointer piVar6;
  int iVar7;
  int *piVar8;
  long lVar9;
  ulong uVar10;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = *i;
  if (0 < iVar3) {
    lVar9 = 0;
    uVar10 = 0;
    do {
      piVar5 = (ord->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      uVar4 = (long)(ord->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
      if (uVar4 <= uVar10) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar10,uVar4);
      }
      piVar8 = (int *)((long)piVar5 + lVar9);
      iVar1._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar1,piVar8);
      }
      else {
        *iVar1._M_current = *piVar8;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      uVar10 = uVar10 + 1;
      iVar3 = *i;
      lVar9 = lVar9 + 4;
    } while ((long)uVar10 < (long)iVar3);
  }
  iVar7 = *k;
  if (iVar3 <= iVar7) {
    lVar9 = (long)iVar7 * 4;
    uVar10 = (long)iVar7;
    do {
      piVar5 = (ord->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      uVar4 = (long)(ord->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
      if (uVar4 <= uVar10) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar10,uVar4);
      }
      piVar8 = (int *)((long)piVar5 + lVar9);
      iVar1._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar1,piVar8);
      }
      else {
        *iVar1._M_current = *piVar8;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      lVar9 = lVar9 + -4;
      bVar2 = (long)*i < (long)uVar10;
      uVar10 = uVar10 - 1;
    } while (bVar2);
    iVar7 = *k;
  }
  uVar10 = (ulong)(iVar7 + 1);
  piVar5 = (ord->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar6 = (ord->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (uVar10 < (ulong)((long)piVar6 - (long)piVar5 >> 2)) {
    lVar9 = (long)iVar7 * 4;
    do {
      lVar9 = lVar9 + 4;
      iVar1._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar1,
                   (int *)((long)piVar5 + lVar9));
        piVar5 = (ord->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6 = (ord->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      else {
        *iVar1._M_current = *(int *)((long)piVar5 + lVar9);
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)((long)piVar6 - (long)piVar5 >> 2));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> Graph<T>::twoOptSwap(const vector<int> &ord, const int &i, const int &k) {
    vector<int> new_ord;

    for (int c = 0; c < i; c++) {
        new_ord.push_back(ord.at(c));
    }

    for (int c = k; c >= i; c--) {
        new_ord.push_back(ord.at(c));
    }

    for (int c = k + 1; c < ord.size(); c++) {
        new_ord.push_back(ord.at(c));
    }

    return new_ord;
}